

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O2

void __thiscall AmpIO::InitWriteBuffer(AmpIO *this)

{
  byte bVar1;
  uint uVar2;
  uint32_t uVar3;
  uint *puVar4;
  uint uVar5;
  ulong uVar6;
  
  uVar3 = BoardIO::GetFirmwareVersion((BoardIO *)this);
  if (uVar3 < 8) {
    this->WB_CURR_OFFSET = 0;
    uVar2 = this->NumMotors;
    puVar4 = &this->WB_CTRL_OFFSET;
    this->WB_CTRL_OFFSET = uVar2;
    bVar1 = (this->super_FpgaIO).super_BoardIO.BoardId;
    uVar5 = 0;
    for (uVar6 = 0; uVar2 != uVar6; uVar6 = uVar6 + 1) {
      this->WriteBuffer[this->WB_CURR_OFFSET + uVar6] = (bVar1 & 0xf) << 0x18;
    }
  }
  else {
    this->WB_CURR_OFFSET = 1;
    uVar5 = this->NumMotors;
    this->WB_CTRL_OFFSET = uVar5 + 1;
    memset(this->WriteBuffer,0,0x100);
    uVar5 = uVar5 + 2 & 0xff | ((this->super_FpgaIO).super_BoardIO.BoardId & 0xf) << 8;
    puVar4 = &this->WB_HEADER_OFFSET;
  }
  this->WriteBuffer[*puVar4] = uVar5;
  return;
}

Assistant:

void AmpIO::InitWriteBuffer(void)
{
    if (GetFirmwareVersion() < 8) {
        WB_CURR_OFFSET = 0;
        WB_CTRL_OFFSET = WB_CURR_OFFSET + NumMotors;
        quadlet_t data = (BoardId & 0x0F) << 24;
        for (size_t i = 0; i < NumMotors; i++) {
            WriteBuffer[WB_CURR_OFFSET+i] = data;
        }
        WriteBuffer[WB_CTRL_OFFSET] = 0;
    } else {
        WB_CURR_OFFSET = 1;
        WB_CTRL_OFFSET = WB_CURR_OFFSET + NumMotors;
        //std::fill(std::begin(WriteBuffer), std::end(WriteBuffer), 0);
        memset(WriteBuffer, 0, sizeof(WriteBuffer));
        // Write buffer size = NumMotors+2 (quadlets)
        WriteBuffer[WB_HEADER_OFFSET] = (BoardId & 0x0F) << 8 | ((NumMotors+2) & 0xFF);
    }
}